

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O1

SurfaceInfo * Omega_h::get_surface_info(SurfaceInfo *__return_storage_ptr__,Mesh *mesh)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  int ent_dim;
  bool bVar4;
  Reals curv_vert_tangents;
  Reals curv_edge_tangents;
  Reals surf_tri_IIs;
  LOs surf_vert2vert;
  LOs surf_side2side;
  Reals curv_edge_curvatures;
  Reals curv_vert_curvatures;
  Read<signed_char> verts_are_surf;
  Read<signed_char> sides_are_surf;
  Reals surf_vert_IIs;
  Alloc *local_2a8;
  void *pvStack_2a0;
  Alloc *local_298;
  void *pvStack_290;
  Alloc *local_288;
  void *local_280;
  Alloc *local_278;
  void *local_270;
  Alloc *local_268;
  void *pvStack_260;
  Alloc *local_250;
  void *local_248;
  Alloc *local_240;
  void *local_238;
  Alloc *local_230;
  void *local_228;
  Alloc *local_220;
  void *local_218;
  Reals local_210;
  LOs local_200;
  LOs local_1f0;
  Reals local_1e0;
  LOs local_1d0;
  Reals local_1c0;
  LOs local_1b0;
  LOs local_1a0;
  Reals local_190;
  Reals local_180;
  LOs local_170;
  LOs local_160;
  Reals local_150;
  LOs local_140;
  Reals local_130;
  LOs local_120;
  LOs local_110;
  Reals local_100;
  LOs local_f0;
  LOs local_e0;
  Reals local_d0;
  Reals local_c0;
  Read<signed_char> local_b0;
  Read<signed_char> local_a0;
  LOs local_90;
  LOs local_80;
  Read<signed_char> local_70;
  Read<signed_char> local_60;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  Alloc *local_30;
  void *local_28;
  
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  uVar2 = mesh->dim_;
  if (3 < uVar2) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (uVar2 != 1) {
    ent_dim = uVar2 - 1;
    mark_by_class_dim((Omega_h *)&local_40,mesh,ent_dim,ent_dim);
    mark_by_class_dim((Omega_h *)&local_50,mesh,0,ent_dim);
    local_60.write_.shared_alloc_.alloc = local_40;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
      }
      else {
        local_40->use_count = local_40->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = local_38;
    collect_marked((Omega_h *)&local_240,&local_60);
    pAVar3 = local_60.write_.shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_70.write_.shared_alloc_.alloc = local_50;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = local_48;
    collect_marked((Omega_h *)&local_250,&local_70);
    pAVar3 = local_70.write_.shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    if (3 < (uint)mesh->dim_) {
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    if (mesh->dim_ == 3) {
      local_80.write_.shared_alloc_.alloc = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = local_238;
      get_side_vectors((Omega_h *)&local_278,mesh,&local_80);
      pAVar3 = local_80.write_.shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_120.write_.shared_alloc_.alloc = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_120.write_.shared_alloc_.alloc = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      local_120.write_.shared_alloc_.direct_ptr = local_238;
      local_130.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_130.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      local_130.write_.shared_alloc_.direct_ptr = local_270;
      local_90.write_.shared_alloc_.alloc = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.write_.shared_alloc_.alloc = (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      local_90.write_.shared_alloc_.direct_ptr = local_248;
      get_side_vert_normals((Omega_h *)&local_288,mesh,&local_120,&local_130,&local_90);
      pAVar3 = local_90.write_.shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_130.write_.shared_alloc_.alloc;
      if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
          local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_120.write_.shared_alloc_.alloc;
      if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
          local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_120.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_120.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      mark_by_class_dim((Omega_h *)&local_230,mesh,1,1);
      mark_by_class_dim((Omega_h *)&local_220,mesh,0,1);
      local_a0.write_.shared_alloc_.alloc = local_230;
      if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_230->size * 8 + 1);
        }
        else {
          local_230->use_count = local_230->use_count + 1;
        }
      }
      local_a0.write_.shared_alloc_.direct_ptr = local_228;
      collect_marked((Omega_h *)&local_268,&local_a0);
      pAVar3 = local_a0.write_.shared_alloc_.alloc;
      local_298 = local_268;
      pvStack_290 = pvStack_260;
      if ((((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_268->use_count = local_268->use_count + -1;
        local_298 = (Alloc *)(local_268->size * 8 + 1);
      }
      local_268 = (Alloc *)0x0;
      pvStack_260 = (void *)0x0;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_b0.write_.shared_alloc_.alloc = local_220;
      if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_220->size * 8 + 1);
        }
        else {
          local_220->use_count = local_220->use_count + 1;
        }
      }
      local_b0.write_.shared_alloc_.direct_ptr = local_218;
      collect_marked((Omega_h *)&local_268,&local_b0);
      pAVar3 = local_b0.write_.shared_alloc_.alloc;
      local_2a8 = local_268;
      pvStack_2a0 = pvStack_260;
      if ((((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_268->use_count = local_268->use_count + -1;
        local_2a8 = (Alloc *)(local_268->size * 8 + 1);
      }
      local_268 = (Alloc *)0x0;
      pvStack_260 = (void *)0x0;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_140.write_.shared_alloc_.alloc = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_140.write_.shared_alloc_.alloc = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      local_140.write_.shared_alloc_.direct_ptr = local_238;
      local_150.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      local_150.write_.shared_alloc_.direct_ptr = local_270;
      local_160.write_.shared_alloc_.alloc = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_160.write_.shared_alloc_.alloc = (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      local_160.write_.shared_alloc_.direct_ptr = local_248;
      local_c0.write_.shared_alloc_.alloc = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_288->size * 8 + 1);
        }
        else {
          local_288->use_count = local_288->use_count + 1;
        }
      }
      local_c0.write_.shared_alloc_.direct_ptr = local_280;
      get_surf_tri_IIs((Omega_h *)&local_268,mesh,&local_140,&local_150,&local_160,&local_c0);
      pAVar3 = local_c0.write_.shared_alloc_.alloc;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_160.write_.shared_alloc_.alloc;
      if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
          local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_160.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_150.write_.shared_alloc_.alloc;
      if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
          local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_150.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_140.write_.shared_alloc_.alloc;
      if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
          local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_170.write_.shared_alloc_.alloc = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_170.write_.shared_alloc_.alloc = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      local_170.write_.shared_alloc_.direct_ptr = local_238;
      local_180.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_180.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      local_180.write_.shared_alloc_.direct_ptr = local_270;
      local_190.write_.shared_alloc_.alloc = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190.write_.shared_alloc_.alloc = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      local_190.write_.shared_alloc_.direct_ptr = pvStack_260;
      local_1a0.write_.shared_alloc_.alloc = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0.write_.shared_alloc_.alloc = (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      local_1a0.write_.shared_alloc_.direct_ptr = local_248;
      local_d0.write_.shared_alloc_.alloc = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_288->size * 8 + 1);
        }
        else {
          local_288->use_count = local_288->use_count + 1;
        }
      }
      local_d0.write_.shared_alloc_.direct_ptr = local_280;
      get_surf_vert_IIs((Omega_h *)&local_30,mesh,&local_170,&local_180,&local_190,&local_1a0,
                        &local_d0);
      pAVar3 = local_d0.write_.shared_alloc_.alloc;
      if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_1a0.write_.shared_alloc_.alloc;
      if (((ulong)local_1a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1a0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_190.write_.shared_alloc_.alloc;
      if (((ulong)local_190.write_.shared_alloc_.alloc & 7) == 0 &&
          local_190.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_190.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_190.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_180.write_.shared_alloc_.alloc;
      if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
          local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_180.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_180.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_170.write_.shared_alloc_.alloc;
      if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
          local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_170.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_170.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc =
               (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.direct_ptr = local_248;
      pAVar3 = (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc =
               (Alloc *)(local_288->size * 8 + 1);
        }
        else {
          local_288->use_count = local_288->use_count + 1;
        }
      }
      (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.direct_ptr = local_280;
      pAVar3 = (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc = local_30;
      bVar4 = ((ulong)local_30 & 7) != 0;
      if (bVar4 || local_30 == (Alloc *)0x0) {
        (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.direct_ptr = local_28;
      }
      else {
        if (entering_parallel == '\x01') {
          (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc =
               (Alloc *)(local_30->size * 8 + 1);
        }
        else {
          local_30->use_count = local_30->use_count + 1;
        }
        (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.direct_ptr = local_28;
        if (!bVar4 && local_30 != (Alloc *)0x0) {
          piVar1 = &local_30->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_30);
            operator_delete(local_30,0x48);
          }
        }
      }
      pAVar3 = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        piVar1 = &local_268->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_268);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_220;
      if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
        piVar1 = &local_220->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_220);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_230;
      if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
        piVar1 = &local_230->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_230);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        piVar1 = &local_288->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_288);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        piVar1 = &local_278->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_278);
          operator_delete(pAVar3,0x48);
        }
      }
    }
    else {
      local_298 = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_298 = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      pvStack_290 = local_238;
      local_2a8 = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2a8 = (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      pvStack_2a0 = local_248;
    }
    local_e0.write_.shared_alloc_.alloc = local_298;
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    local_e0.write_.shared_alloc_.direct_ptr = pvStack_290;
    get_curv_edge_tangents((Omega_h *)&local_278,mesh,&local_e0);
    pAVar3 = local_e0.write_.shared_alloc_.alloc;
    if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_1b0.write_.shared_alloc_.alloc = local_298;
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b0.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    local_1b0.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_1c0.write_.shared_alloc_.alloc = local_278;
    if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1c0.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
      }
      else {
        local_278->use_count = local_278->use_count + 1;
      }
    }
    local_1c0.write_.shared_alloc_.direct_ptr = local_270;
    local_f0.write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    local_f0.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    get_curv_vert_tangents((Omega_h *)&local_288,mesh,&local_1b0,&local_1c0,&local_f0);
    pAVar3 = local_f0.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1c0.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1c0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1c0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1b0.write_.shared_alloc_.alloc;
    if (((ulong)local_1b0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1b0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1b0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_1d0.write_.shared_alloc_.alloc = local_298;
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1d0.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    local_1d0.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_1e0.write_.shared_alloc_.alloc = local_278;
    if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e0.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
      }
      else {
        local_278->use_count = local_278->use_count + 1;
      }
    }
    local_1e0.write_.shared_alloc_.direct_ptr = local_270;
    local_1f0.write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f0.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    local_1f0.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    local_100.write_.shared_alloc_.alloc = local_288;
    if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.write_.shared_alloc_.alloc = (Alloc *)(local_288->size * 8 + 1);
      }
      else {
        local_288->use_count = local_288->use_count + 1;
      }
    }
    local_100.write_.shared_alloc_.direct_ptr = local_280;
    get_curv_edge_curvatures((Omega_h *)&local_230,mesh,&local_1d0,&local_1e0,&local_1f0,&local_100)
    ;
    pAVar3 = local_100.write_.shared_alloc_.alloc;
    if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
        local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1f0.write_.shared_alloc_.alloc;
    if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1e0.write_.shared_alloc_.alloc;
    if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1d0.write_.shared_alloc_.alloc;
    if (((ulong)local_1d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1d0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_200.write_.shared_alloc_.alloc = local_298;
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_200.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    local_200.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_210.write_.shared_alloc_.alloc = local_230;
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_210.write_.shared_alloc_.alloc = (Alloc *)(local_230->size * 8 + 1);
      }
      else {
        local_230->use_count = local_230->use_count + 1;
      }
    }
    local_210.write_.shared_alloc_.direct_ptr = local_228;
    local_110.write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    local_110.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    get_curv_vert_curvatures((Omega_h *)&local_220,mesh,&local_200,&local_210,&local_110);
    pAVar3 = local_110.write_.shared_alloc_.alloc;
    if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
        local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_210.write_.shared_alloc_.alloc;
    if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
        local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_200.write_.shared_alloc_.alloc;
    if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
        local_200.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_200.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_200.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc =
             (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.direct_ptr = pvStack_2a0;
    pAVar3 = (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc = local_288;
    if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc =
             (Alloc *)(local_288->size * 8 + 1);
      }
      else {
        local_288->use_count = local_288->use_count + 1;
      }
    }
    (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.direct_ptr = local_280;
    pAVar3 = (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc = local_220;
    bVar4 = ((ulong)local_220 & 7) != 0;
    if (bVar4 || local_220 == (Alloc *)0x0) {
      (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = local_218;
    }
    else {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc =
             (Alloc *)(local_220->size * 8 + 1);
      }
      else {
        local_220->use_count = local_220->use_count + 1;
      }
      (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = local_218;
      if (!bVar4 && local_220 != (Alloc *)0x0) {
        piVar1 = &local_220->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_220);
          operator_delete(local_220,0x48);
        }
      }
    }
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      piVar1 = &local_230->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_230);
        operator_delete(local_230,0x48);
      }
    }
    if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
      piVar1 = &local_288->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_288);
        operator_delete(local_288,0x48);
      }
    }
    if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
      piVar1 = &local_278->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_278);
        operator_delete(local_278,0x48);
      }
    }
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      piVar1 = &local_2a8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2a8);
        operator_delete(local_2a8,0x48);
      }
    }
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      piVar1 = &local_298->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_298);
        operator_delete(local_298,0x48);
      }
    }
    if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
      piVar1 = &local_250->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_250);
        operator_delete(local_250,0x48);
      }
    }
    if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
      piVar1 = &local_240->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_240);
        operator_delete(local_240,0x48);
      }
    }
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      piVar1 = &local_50->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50);
        operator_delete(local_50,0x48);
      }
    }
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      piVar1 = &local_40->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40);
        operator_delete(local_40,0x48);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SurfaceInfo get_surface_info(Mesh* mesh) {
  SurfaceInfo out;
  if (mesh->dim() == 1) return out;
  auto sdim = mesh->dim() - 1;
  auto sides_are_surf = mark_by_class_dim(mesh, sdim, sdim);
  auto verts_are_surf = mark_by_class_dim(mesh, VERT, sdim);
  auto surf_side2side = collect_marked(sides_are_surf);
  auto surf_vert2vert = collect_marked(verts_are_surf);
  LOs curv_edge2edge;
  LOs curv_vert2vert;
  if (mesh->dim() == 3) {
    auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
    auto surf_vert_normals = get_side_vert_normals(
        mesh, surf_side2side, surf_side_normals, surf_vert2vert);
    auto edges_are_curv = mark_by_class_dim(mesh, EDGE, EDGE);
    auto verts_are_curv = mark_by_class_dim(mesh, VERT, EDGE);
    curv_edge2edge = collect_marked(edges_are_curv);
    curv_vert2vert = collect_marked(verts_are_curv);
    auto surf_tri_IIs = get_surf_tri_IIs(mesh, surf_side2side,
        surf_side_normals, surf_vert2vert, surf_vert_normals);
    auto surf_vert_IIs = get_surf_vert_IIs(mesh, surf_side2side,
        surf_side_normals, surf_tri_IIs, surf_vert2vert, surf_vert_normals);
    out.surf_vert2vert = surf_vert2vert;
    out.surf_vert_normals = surf_vert_normals;
    out.surf_vert_IIs = surf_vert_IIs;
  } else {
    curv_edge2edge = surf_side2side;
    curv_vert2vert = surf_vert2vert;
  }
  auto curv_edge_tangents = get_curv_edge_tangents(mesh, curv_edge2edge);
  auto curv_vert_tangents = get_curv_vert_tangents(
      mesh, curv_edge2edge, curv_edge_tangents, curv_vert2vert);
  auto curv_edge_curvatures = get_curv_edge_curvatures(mesh, curv_edge2edge,
      curv_edge_tangents, curv_vert2vert, curv_vert_tangents);
  auto curv_vert_curvatures = get_curv_vert_curvatures(
      mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  out.curv_vert2vert = curv_vert2vert;
  out.curv_vert_tangents = curv_vert_tangents;
  out.curv_vert_curvatures = curv_vert_curvatures;
  return out;
}